

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void baryonyx::itm::
     random_shuffle_unique<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*>
               (rc_data *begin,rc_data *end,random_engine *rng)

{
  rc_data *local_28;
  rc_data *ret;
  random_engine *rng_local;
  rc_data *end_local;
  rc_data *begin_local;
  
  local_28 = begin;
  for (end_local = begin + 1; end_local != end; end_local = end_local + 1) {
    if ((local_28->value != end_local->value) || (NAN(local_28->value) || NAN(end_local->value))) {
      std::
      shuffle<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                (local_28,end_local,rng);
      local_28 = end_local;
    }
  }
  std::
  shuffle<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
            (local_28,end_local,rng);
  return;
}

Assistant:

inline void
random_shuffle_unique(iteratorT begin,
                      iteratorT end,
                      random_engine& rng) noexcept
{
    auto ret = begin++;
    for (; begin != end; ++begin) {
        if (ret->value != begin->value) {
            std::shuffle(ret, begin, rng);
            ret = begin;
        }
    }

    std::shuffle(ret, begin, rng);
}